

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O1

int __thiscall Counter64::fromBuffer(Counter64 *this,uint8_t *buf,size_t max_len)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  byte *pbVar6;
  
  uVar3 = BER_CONTAINER::fromBuffer(&this->super_BER_CONTAINER,buf,max_len);
  if (-1 < (int)uVar3) {
    iVar2 = (this->super_BER_CONTAINER)._length;
    this->_value = 0;
    if (0 < iVar2) {
      pbVar6 = buf + uVar3;
      iVar4 = iVar2 + 1;
      uVar5 = 0;
      do {
        this->_value = uVar5 << 8;
        bVar1 = *pbVar6;
        pbVar6 = pbVar6 + 1;
        uVar5 = uVar5 << 8 | (ulong)bVar1;
        this->_value = uVar5;
        iVar4 = iVar4 + -1;
      } while (1 < iVar4);
    }
    uVar3 = iVar2 + 2;
  }
  return uVar3;
}

Assistant:

int Counter64::fromBuffer(const uint8_t *buf, size_t max_len){
    int i = BER_CONTAINER::fromBuffer(buf, max_len);
    CHECK_DECODE_ERR(i);
    const uint8_t* ptr = buf + i;

    int tempLength = _length;
    _value = 0;
    while(tempLength > 0){
        _value = _value << 8U;
        _value = _value | *ptr++;
        tempLength--;
    }
    return _length + 2;
}